

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O3

void helicsEndpointSetDefaultDestination(HelicsEndpoint endpoint,char *dest,HelicsError *err)

{
  Endpoint *this;
  char *pcVar1;
  size_t sVar2;
  string_view target;
  
  if (err == (HelicsError *)0x0) {
    if (endpoint == (HelicsEndpoint)0x0) {
      return;
    }
    if (dest == (char *)0x0 || *(int *)((long)endpoint + 0x20) != -0x4bac6b3e) {
      return;
    }
LAB_001a989b:
    this = *endpoint;
    sVar2 = strlen(dest);
    target._M_str = dest;
    target._M_len = sVar2;
    helics::Endpoint::setDefaultDestination(this,target);
  }
  else {
    if (err->error_code != 0) {
      return;
    }
    if ((endpoint == (HelicsEndpoint)0x0) || (*(int *)((long)endpoint + 0x20) != -0x4bac6b3e)) {
      err->error_code = -3;
      pcVar1 = "The given endpoint does not point to a valid object";
    }
    else {
      if (dest != (char *)0x0) goto LAB_001a989b;
      err->error_code = -4;
      pcVar1 = "The supplied string argument is null and therefore invalid";
    }
    err->message = pcVar1;
  }
  return;
}

Assistant:

void helicsEndpointSetDefaultDestination(HelicsEndpoint endpoint, const char* dest, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    CHECK_NULL_STRING(dest, void());
    try {
        endObj->endPtr->setDefaultDestination(dest);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}